

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O3

FT_Error sdf_generate_subdivision
                   (SDF_Params internal_params,SDF_Shape *shape,FT_UInt spread,FT_Bitmap *bitmap)

{
  ulong *puVar1;
  SDF_Edge_Type SVar2;
  SDF_Contour_ *pSVar3;
  ulong uVar4;
  FT_Bitmap *pFVar5;
  int iVar6;
  FT_Error FVar7;
  SDF_Edge *pSVar8;
  ulong uVar9;
  FT_Bitmap *pFVar10;
  uint *puVar11;
  SDF_Contour *pSVar12;
  FT_Long FVar13;
  long lVar14;
  ulong uVar15;
  char cVar16;
  ushort uVar17;
  int iVar18;
  undefined4 in_register_0000000c;
  long lVar19;
  ulong uVar20;
  char cVar21;
  FT_UInt max_splits;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  long lVar25;
  SDF_Edge *pSVar26;
  SDF_Edge *pSVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  uint uVar31;
  SDF_Edge *pSVar32;
  FT_Memory pFVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  long lVar37;
  uint uVar38;
  uint uVar39;
  ulong uVar40;
  SDF_Edge *edge;
  long lVar41;
  uint *puVar42;
  bool bVar43;
  byte bVar44;
  SDF_Edge *new_edges;
  FT_26D6_Vec ctrls [3];
  FT_Vector local_1c0;
  FT_Bitmap *local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  long local_198;
  FT_Bitmap *local_190;
  uint local_184;
  uint *local_180;
  FT_Memory local_178;
  uint local_16c;
  FT_26D6_Vec local_168;
  long local_158;
  long lStack_150;
  long local_148;
  long lStack_140;
  FT_Pos local_138;
  FT_Pos FStack_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  ulong local_e8;
  ulong local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  FT_Int local_a8;
  int local_a4;
  ulong local_a0;
  long local_98;
  long local_90;
  SDF_Edge *local_88;
  ulong local_80;
  SDF_Contour *local_78;
  long local_70;
  ulong local_68;
  ulong local_60;
  SDF_Edge *local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_128 = CONCAT44(in_register_0000000c,spread);
  local_a8 = internal_params.overload_sign;
  local_120 = internal_params._0_8_;
  bVar44 = 0;
  FVar7 = 6;
  if ((shape != (SDF_Shape *)0x0) && (pFVar33 = shape->memory, pFVar33 != (FT_Memory)0x0)) {
    local_190 = bitmap;
    if (shape->contours == (SDF_Contour *)0x0) {
      pFVar10 = (FT_Bitmap *)0x0;
    }
    else {
      pFVar10 = (FT_Bitmap *)0x0;
      pSVar12 = shape->contours;
      do {
        pSVar26 = pSVar12->edges;
        local_1c0.x = 0;
        local_1b0 = pFVar10;
        for (; pSVar26 != (SDF_Edge *)0x0; pSVar26 = pSVar26->next) {
          SVar2 = pSVar26->edge_type;
          if (SVar2 == SDF_EDGE_CUBIC) {
            local_168.x = (pSVar26->start_pos).x;
            local_168.y = (pSVar26->start_pos).y;
            local_158 = (pSVar26->control_a).x;
            lStack_150 = (pSVar26->control_a).y;
            local_148 = (pSVar26->control_b).x;
            lStack_140 = (pSVar26->control_b).y;
            local_138 = (pSVar26->end_pos).x;
            FStack_130 = (pSVar26->end_pos).y;
            iVar6 = split_sdf_cubic(pFVar33,&local_168,0x20,(SDF_Edge **)&local_1c0);
LAB_0023df4d:
            if (iVar6 != 0) {
              return iVar6;
            }
          }
          else {
            if (SVar2 == SDF_EDGE_CONIC) {
              local_168.x = (pSVar26->start_pos).x;
              local_168.y = (pSVar26->start_pos).y;
              local_158 = (pSVar26->control_a).x;
              lStack_150 = (pSVar26->control_a).y;
              local_148 = (pSVar26->end_pos).x;
              lStack_140 = (pSVar26->end_pos).y;
              uVar9 = local_168.x + local_148 + local_158 * -2;
              uVar36 = -uVar9;
              if (0 < (long)uVar9) {
                uVar36 = uVar9;
              }
              uVar20 = local_168.y + lStack_140 + lStack_150 * -2;
              uVar9 = -uVar20;
              if (0 < (long)uVar20) {
                uVar9 = uVar20;
              }
              if ((int)uVar9 < (int)uVar36) {
                uVar9 = uVar36;
              }
              max_splits = 1;
              if (8 < (int)uVar9) {
                uVar36 = uVar9 & 0xffffffff;
                do {
                  max_splits = max_splits * 2;
                  uVar38 = (uint)uVar36;
                  uVar36 = uVar36 >> 2;
                } while (0x23 < uVar38);
              }
              iVar6 = split_sdf_conic(pFVar33,&local_168,max_splits,(SDF_Edge **)&local_1c0);
              goto LAB_0023df4d;
            }
            if (SVar2 != SDF_EDGE_LINE) {
              return 6;
            }
            local_168.x = (ulong)local_168.x._4_4_ << 0x20;
            pSVar8 = (SDF_Edge *)ft_mem_qalloc(pFVar33,0x50,(FT_Error *)&local_168);
            if ((int)local_168.x != 0) {
              return (int)local_168.x;
            }
            *(undefined8 *)&pSVar8->edge_type = 0;
            pSVar8->next = (SDF_Edge_ *)0x0;
            (pSVar8->control_b).x = 0;
            (pSVar8->control_b).y = 0;
            (pSVar8->control_a).x = 0;
            (pSVar8->control_a).y = 0;
            (pSVar8->end_pos).x = 0;
            (pSVar8->end_pos).y = 0;
            (pSVar8->start_pos).x = 0;
            (pSVar8->start_pos).y = 0;
            pSVar27 = pSVar26;
            pSVar32 = pSVar8;
            for (lVar19 = 9; lVar19 != 0; lVar19 = lVar19 + -1) {
              (pSVar32->start_pos).x = (pSVar27->start_pos).x;
              pSVar27 = (SDF_Edge *)((long)pSVar27 + (ulong)bVar44 * -0x10 + 8);
              pSVar32 = (SDF_Edge *)((long)pSVar32 + (ulong)bVar44 * -0x10 + 8);
            }
            pSVar8->next = (SDF_Edge_ *)local_1c0.x;
            local_1c0.x = (FT_Pos)pSVar8;
          }
        }
        local_168.x = (ulong)local_168.x._4_4_ << 0x20;
        pFVar10 = (FT_Bitmap *)ft_mem_qalloc(pFVar33,0x20,(FT_Error *)&local_168);
        if ((int)local_168.x != 0) {
          return (int)local_168.x;
        }
        pFVar10->rows = 0;
        pFVar10->width = 0;
        *(FT_Pos *)&pFVar10->pitch = 0;
        *(FT_Bitmap **)&pFVar10->num_grays = local_1b0;
        pFVar10->buffer = (uchar *)local_1c0.x;
        local_1c0.x = 0;
        pSVar3 = pSVar12->next;
        local_1a8 = pSVar12;
        sdf_contour_done(pFVar33,(SDF_Contour **)&local_1a8);
        pSVar12 = pSVar3;
      } while (pSVar3 != (SDF_Contour_ *)0x0);
    }
    pFVar5 = local_190;
    pSVar12 = local_1a8;
    shape->contours = (SDF_Contour *)pFVar10;
    local_1a8 = (SDF_Contour *)((ulong)local_1a8 & 0xffffffff00000000);
    if (((local_190 == (FT_Bitmap *)0x0) || ((int)local_128 - 0x21U < 0xffffffe1)) ||
       (pFVar33 = shape->memory, pFVar33 == (FT_Memory)0x0)) {
      local_1a8._4_4_ = SUB84(pSVar12,4);
      local_1a8 = (SDF_Contour *)CONCAT44(local_1a8._4_4_,6);
      puVar11 = (uint *)0x0;
      pFVar33 = (FT_Memory)0x0;
    }
    else {
      local_178 = pFVar33;
      puVar11 = (uint *)ft_mem_alloc(pFVar33,(ulong)((int)((FT_26D6_Vec *)&local_190->rows)->x *
                                                    local_190->width) * 0xc,(FT_Error *)&local_1a8);
      pFVar33 = local_178;
      if ((int)local_1a8 == 0) {
        uVar36 = (ulong)(int)pFVar5->width;
        local_184 = (uint)((FT_26D6_Vec *)&pFVar5->rows)->x;
        local_180 = puVar11;
        if (local_184 == 0 || uVar36 == 0) {
          local_1a8 = (SDF_Contour *)CONCAT44(local_1a8._4_4_,0x13);
        }
        else {
          uVar38 = (int)local_128 << 0x10;
          local_88 = (SDF_Edge *)pFVar5->buffer;
          pSVar12 = shape->contours;
          local_16c = uVar38;
          if (pSVar12 != (SDF_Contour *)0x0) {
            local_48 = (long)(int)local_184;
            local_a0 = local_128 & 0xffffffff;
            local_60 = local_120 & 0xffffffff;
            uVar9 = local_128;
            local_e0 = uVar36;
            do {
              local_78 = pSVar12;
              for (pSVar26 = pSVar12->edges; pSVar26 != (SDF_Edge *)0x0; pSVar26 = pSVar26->next) {
                uVar20 = (pSVar26->start_pos).x;
                uVar40 = (pSVar26->start_pos).y;
                uVar15 = (pSVar26->end_pos).x;
                uVar30 = (pSVar26->end_pos).y;
                SVar2 = pSVar26->edge_type;
                uVar22 = uVar40;
                uVar28 = uVar20;
                if (SVar2 == SDF_EDGE_LINE) {
LAB_0023e17d:
                  if ((long)uVar15 < (long)uVar28) {
                    uVar28 = uVar15;
                  }
                  if ((long)uVar20 < (long)uVar15) {
                    uVar20 = uVar15;
                  }
                  if ((long)uVar30 < (long)uVar22) {
                    uVar22 = uVar30;
                  }
                  if ((long)uVar40 < (long)uVar30) {
                    uVar40 = uVar30;
                  }
                  uVar15 = uVar28 - 0x3f;
                  if ((long)(uVar28 - 0x3f) < 0) {
                    uVar15 = uVar28;
                  }
                  iVar6 = (int)(uVar15 >> 6);
                  lVar19 = uVar20 + 0x7e;
                  if (-1 < (long)(uVar20 + 0x3f)) {
                    lVar19 = uVar20 + 0x3f;
                  }
                  lVar19 = lVar19 >> 6;
                  uVar20 = uVar22 - 0x3f;
                  if ((long)(uVar22 - 0x3f) < 0) {
                    uVar20 = uVar22;
                  }
                  iVar18 = (int)(uVar20 >> 6);
                  lVar25 = uVar40 + 0x7e;
                  if (-1 < (long)(uVar40 + 0x3f)) {
                    lVar25 = uVar40 + 0x3f;
                  }
                  lVar25 = lVar25 >> 6;
                }
                else {
                  uVar35 = (pSVar26->control_a).x;
                  uVar34 = (pSVar26->control_a).y;
                  uVar22 = uVar34;
                  uVar28 = uVar35;
                  if (SVar2 == SDF_EDGE_CONIC) {
LAB_0023e159:
                    if ((long)uVar20 < (long)uVar28) {
                      uVar28 = uVar20;
                    }
                    if ((long)uVar20 <= (long)uVar35) {
                      uVar20 = uVar35;
                    }
                    if ((long)uVar40 < (long)uVar22) {
                      uVar22 = uVar40;
                    }
                    if ((long)uVar40 <= (long)uVar34) {
                      uVar40 = uVar34;
                    }
                    goto LAB_0023e17d;
                  }
                  if (SVar2 == SDF_EDGE_CUBIC) {
                    uVar22 = (pSVar26->control_b).x;
                    uVar4 = (pSVar26->control_b).y;
                    uVar28 = uVar22;
                    if ((long)uVar35 < (long)uVar22) {
                      uVar28 = uVar35;
                    }
                    if ((long)uVar35 <= (long)uVar22) {
                      uVar35 = uVar22;
                    }
                    uVar22 = uVar4;
                    if ((long)uVar34 < (long)uVar4) {
                      uVar22 = uVar34;
                    }
                    if ((long)uVar34 <= (long)uVar4) {
                      uVar34 = uVar4;
                    }
                    goto LAB_0023e159;
                  }
                  iVar6 = 0;
                  iVar18 = 0;
                  lVar19 = 0;
                  lVar25 = 0;
                }
                lVar37 = (long)(iVar18 - (int)uVar9);
                if (lVar37 < (long)(lVar25 + local_a0)) {
                  lVar19 = lVar19 + local_a0;
                  local_98 = (long)(iVar6 - (int)local_128);
                  local_d8 = lVar19;
                  local_70 = lVar25 + local_a0;
                  local_58 = pSVar26;
                  do {
                    if (local_98 < lVar19) {
                      local_190 = (FT_Bitmap *)(lVar37 << 6 | 0x20);
                      local_90 = (long)local_190 << 10;
                      uVar24 = ~(uint)lVar37 + local_184;
                      if (local_120 >> 0x28 != 0) {
                        uVar24 = (uint)lVar37;
                      }
                      local_68 = (ulong)(uVar24 * (int)uVar36);
                      lVar25 = local_98;
                      local_50 = lVar37;
                      do {
                        if (((lVar25 < (long)uVar36) &&
                            ((((uint)lVar25 | (uint)lVar37) & 0x80000000) == 0)) &&
                           (lVar37 < local_48)) {
                          local_1b0 = (FT_Bitmap *)(lVar25 << 6 | 0x20);
                          SVar2 = pSVar26->edge_type;
                          local_d0 = lVar25;
                          if (SVar2 == SDF_EDGE_CUBIC) {
                            local_b8 = (pSVar26->start_pos).x;
                            local_c0 = (pSVar26->start_pos).y;
                            lVar19 = (pSVar26->control_a).x;
                            lVar25 = (pSVar26->control_a).y;
                            lVar37 = (pSVar26->control_b).x;
                            lVar41 = (pSVar26->control_b).y;
                            local_108 = ((local_b8 - lVar19) - lVar19) + lVar37;
                            lVar14 = ((local_c0 - lVar25) - lVar25) + lVar41;
                            local_f8 = (lVar19 - local_b8) * 3;
                            local_f0 = (lVar25 - local_c0) * 3;
                            local_198 = (long)((((int)lVar19 - (int)lVar37) * 3 - (int)local_b8) +
                                              (int)(pSVar26->end_pos).x);
                            local_1a0 = local_108 * 0x300000000 >> 0x20;
                            local_c8 = (lVar19 - local_b8) * 0x300000000 >> 0x20;
                            lVar19 = (long)((((int)lVar25 - (int)lVar41) * 3 - (int)local_c0) +
                                           (int)(pSVar26->end_pos).y);
                            lVar37 = lVar14 * 0x300000000 >> 0x20;
                            local_100 = (lVar25 - local_c0) * 0x300000000 >> 0x20;
                            local_108 = local_108 * 6;
                            local_110 = lVar14 * 6;
                            uVar9 = 0x7fffffff;
                            iVar6 = 0;
                            local_118 = 0;
                            local_80 = 0;
                            local_b0 = lVar19;
                            do {
                              uVar38 = iVar6 << 0xe;
                              local_e8 = 0;
                              local_a4 = iVar6;
                              do {
                                uVar36 = (ulong)uVar38;
                                uVar15 = uVar36 * uVar36 + 0x8000;
                                uVar20 = uVar15 >> 0x10 & 0xffffffff;
                                uVar40 = uVar20 * uVar36 + 0x8000 >> 0x10 & 0xffffffff;
                                lVar25 = uVar40 * local_198;
                                lVar19 = uVar40 * lVar19;
                                lVar41 = ((int)((ulong)(lVar25 + 0x8000 + (lVar25 >> 0x3f)) >> 0x10)
                                         + (int)(uVar20 * local_1a0 + 0x8000 +
                                                 ((long)(uVar20 * local_1a0) >> 0x3f) >> 0x10) +
                                           (int)(local_c8 * uVar36 + 0x8000 +
                                                 ((long)(local_c8 * uVar36) >> 0x3f) >> 0x10)) +
                                         local_b8;
                                lVar25 = ((int)((ulong)(lVar19 + 0x8000 + (lVar19 >> 0x3f)) >> 0x10)
                                         + (int)(uVar20 * lVar37 + 0x8000 +
                                                 ((long)(uVar20 * lVar37) >> 0x3f) >> 0x10) +
                                           (int)(uVar36 * local_100 + 0x8000 +
                                                 ((long)(uVar36 * local_100) >> 0x3f) >> 0x10)) +
                                         local_c0;
                                local_168.x = (lVar41 - (long)local_1b0) * 0x400;
                                local_168.y = (lVar25 - (long)local_190) * 0x400;
                                uVar36 = FT_Vector_Length(&local_168);
                                lVar19 = local_b0;
                                if ((int)uVar36 < (int)uVar9) {
                                  local_38 = lVar25 * 0x400;
                                  local_40 = lVar41 * 0x400;
                                  uVar9 = uVar36 & 0xffffffff;
                                  local_80 = uVar15 >> 0x10 & 0xffffffff;
                                  local_118 = (ulong)uVar38;
                                }
                                uVar36 = (ulong)(uint)((int)(uVar15 >> 0x10) * 3);
                                lVar25 = uVar36 * local_198;
                                lVar41 = local_1a0 * (uVar38 * 2);
                                lVar41 = ((int)((ulong)(lVar25 + 0x8000 + (lVar25 >> 0x3f)) >> 0x10)
                                         + (int)((ulong)(lVar41 + 0x8000 + (lVar41 >> 0x3f)) >> 0x10
                                                )) + local_f8;
                                lVar25 = uVar36 * local_b0;
                                lVar14 = lVar37 * (ulong)(uVar38 * 2);
                                lVar14 = ((int)((ulong)(lVar25 + 0x8000 + (lVar25 >> 0x3f)) >> 0x10)
                                         + (int)((ulong)(lVar14 + 0x8000 + (lVar14 >> 0x3f)) >> 0x10
                                                )) + local_f0;
                                lVar23 = local_198 * (int)(uVar38 * 6);
                                lVar29 = (int)(uVar38 * 6) * local_b0;
                                lVar25 = local_168.x + 0x3ff;
                                if (-1 < local_168.x) {
                                  lVar25 = local_168.x;
                                }
                                local_168.x = lVar25 >> 10;
                                lVar25 = local_168.y + 0x3ff;
                                if (-1 < local_168.y) {
                                  lVar25 = local_168.y;
                                }
                                local_168.y = lVar25 >> 10;
                                uVar20 = local_168.x * lVar41;
                                uVar36 = uVar20 + 0x3f;
                                if (-1 < (long)uVar20) {
                                  uVar36 = uVar20;
                                }
                                uVar40 = local_168.y * lVar14;
                                uVar20 = uVar40 + 0x3f;
                                if (-1 < (long)uVar40) {
                                  uVar20 = uVar40;
                                }
                                uVar15 = local_168.x *
                                         ((int)((ulong)(lVar23 + 0x8000 + (lVar23 >> 0x3f)) >> 0x10)
                                         + local_108);
                                uVar40 = uVar15 + 0x3f;
                                if (-1 < (long)uVar15) {
                                  uVar40 = uVar15;
                                }
                                uVar30 = local_168.y *
                                         ((long)(int)((ulong)(lVar29 + 0x8000 + (lVar29 >> 0x3f)) >>
                                                     0x10) + local_110);
                                uVar15 = uVar30 + 0x3f;
                                if (-1 < (long)uVar30) {
                                  uVar15 = uVar30;
                                }
                                FVar13 = FT_DivFix((long)((int)(uVar20 >> 6) + (int)(uVar36 >> 6)),
                                                   (long)((int)(uVar15 >> 6) + (int)(uVar40 >> 6) +
                                                         (int)((ulong)(lVar41 * lVar41) >> 6) +
                                                         (int)((ulong)(lVar14 * lVar14) >> 6)));
                                uVar38 = uVar38 - (int)FVar13;
                              } while ((uVar38 < 0x10001) &&
                                      (uVar36 = (ulong)((int)local_e8 + 1),
                                      uVar17 = (ushort)local_e8, local_e8 = uVar36, uVar17 < 3));
                              iVar6 = local_a4 + 1;
                            } while (iVar6 != 5);
                            lVar25 = (long)((int)local_80 * 3);
                            lVar41 = local_198 * lVar25;
                            uVar36 = (ulong)(uint)((int)local_118 * 2);
                            lVar14 = local_1a0 * uVar36;
                            local_1c0.x = ((int)((ulong)(lVar41 + 0x8000 + (lVar41 >> 0x3f)) >> 0x10
                                                ) + (int)((ulong)(lVar14 + 0x8000 + (lVar14 >> 0x3f)
                                                                 ) >> 0x10)) + local_f8;
                            lVar19 = lVar19 * lVar25;
                            lVar37 = lVar37 * uVar36;
                            local_1c0.y = ((int)((ulong)(lVar19 + 0x8000 + (lVar19 >> 0x3f)) >> 0x10
                                                ) + (int)((ulong)(lVar37 + 0x8000 + (lVar37 >> 0x3f)
                                                                 ) >> 0x10)) + local_f0;
                            lVar37 = local_40 + (long)local_1b0 * -0x400;
                            lVar25 = (long)(int)local_1c0.y * (long)(int)lVar37;
                            lVar19 = (long)(int)local_1c0.x * (long)(int)(local_38 - local_90);
                            bVar43 = (int)((ulong)(lVar19 + 0x8000 + (lVar19 >> 0x3f)) >> 0x10) <=
                                     (int)((ulong)(lVar25 + 0x8000 + (lVar25 >> 0x3f)) >> 0x10);
                            lVar41 = local_38 - local_90;
                            lVar19 = local_168.x;
                            lVar25 = local_168.y;
                            uVar36 = local_118;
joined_r0x0023edc9:
                            local_168.y = lVar41;
                            local_168.x = lVar37;
                            uVar24 = 0x10000;
                            if ((uVar36 & 0xfffeffff) == 0) {
                              FT_Vector_NormLen(&local_1c0);
                              FT_Vector_NormLen(&local_168);
                              uVar24 = (int)((ulong)((long)(int)local_168.y * (long)(int)local_1c0.x
                                                     + 0x8000 +
                                                    ((long)(int)local_168.y * (long)(int)local_1c0.x
                                                    >> 0x3f)) >> 0x10) -
                                       (int)((ulong)((long)(int)local_168.x * (long)(int)local_1c0.y
                                                     + 0x8000 +
                                                    ((long)(int)local_168.x * (long)(int)local_1c0.y
                                                    >> 0x3f)) >> 0x10);
                              lVar19 = local_168.x;
                              lVar25 = local_168.y;
                            }
                            local_168.y = lVar25;
                            local_168.x = lVar19;
                          }
                          else {
                            if (SVar2 == SDF_EDGE_CONIC) {
                              local_e8 = (pSVar26->start_pos).x;
                              local_f0 = (pSVar26->start_pos).y;
                              lVar19 = (pSVar26->control_a).x;
                              lVar25 = (pSVar26->control_a).y;
                              local_b8 = ((local_e8 - lVar19) - lVar19) + (pSVar26->end_pos).x;
                              local_c8 = ((local_f0 - lVar25) - lVar25) + (pSVar26->end_pos).y;
                              local_1a0 = (lVar19 - local_e8) * 2;
                              local_198 = (lVar25 - local_f0) * 2;
                              lVar37 = (long)(int)local_b8;
                              local_f8 = (long)(lVar19 - local_e8 << 0x21) >> 0x20;
                              lVar19 = (long)(int)local_c8;
                              local_b0 = (lVar25 - local_f0 << 0x21) >> 0x20;
                              local_b8 = local_b8 * 2;
                              local_c8 = local_c8 * 2;
                              uVar9 = 0x7fffffff;
                              local_100 = 0;
                              local_108 = 0;
                              iVar6 = 0;
                              local_110 = local_110 & 0xffffffff00000000;
                              local_c0 = lVar37;
                              do {
                                local_118 = CONCAT44(local_118._4_4_,iVar6);
                                uVar38 = iVar6 << 0xe;
                                uVar17 = 0;
                                do {
                                  uVar36 = (ulong)uVar38;
                                  uVar20 = uVar36 * uVar36 + 0x8000 >> 0x10 & 0xffffffff;
                                  lVar37 = uVar20 * lVar37;
                                  lVar41 = (long)((int)((ulong)(lVar37 + 0x8000 + (lVar37 >> 0x3f))
                                                       >> 0x10) +
                                                 (int)(local_f8 * uVar36 + 0x8000 +
                                                       ((long)(local_f8 * uVar36) >> 0x3f) >> 0x10))
                                           + local_e8;
                                  lVar25 = uVar20 * lVar19;
                                  lVar25 = ((int)((ulong)(lVar25 + 0x8000 + (lVar25 >> 0x3f)) >>
                                                 0x10) +
                                           (int)(uVar36 * local_b0 + 0x8000 +
                                                 ((long)(uVar36 * local_b0) >> 0x3f) >> 0x10)) +
                                           local_f0;
                                  local_168.x = (lVar41 - (long)local_1b0) * 0x400;
                                  local_168.y = (lVar25 - (long)local_190) * 0x400;
                                  uVar36 = FT_Vector_Length(&local_168);
                                  lVar37 = local_c0;
                                  if ((int)uVar36 < (int)uVar9) {
                                    local_100 = lVar25 * 0x400;
                                    local_108 = lVar41 * 0x400;
                                    uVar9 = uVar36 & 0xffffffff;
                                    local_110 = CONCAT44(local_110._4_4_,uVar38);
                                  }
                                  lVar25 = local_c0 * (ulong)(uVar38 * 2);
                                  lVar41 = (long)(int)((ulong)(lVar25 + 0x8000 + (lVar25 >> 0x3f))
                                                      >> 0x10) + local_1a0;
                                  lVar25 = (ulong)(uVar38 * 2) * lVar19;
                                  lVar14 = (int)((ulong)(lVar25 + 0x8000 + (lVar25 >> 0x3f)) >> 0x10
                                                ) + local_198;
                                  lVar25 = local_168.x + 0x3ff;
                                  if (-1 < local_168.x) {
                                    lVar25 = local_168.x;
                                  }
                                  local_168.x = lVar25 >> 10;
                                  lVar25 = local_168.y + 0x3ff;
                                  if (-1 < local_168.y) {
                                    lVar25 = local_168.y;
                                  }
                                  local_168.y = lVar25 >> 10;
                                  uVar20 = local_168.x * lVar41;
                                  uVar36 = uVar20 + 0x3f;
                                  if (-1 < (long)uVar20) {
                                    uVar36 = uVar20;
                                  }
                                  uVar40 = local_168.y * lVar14;
                                  uVar20 = uVar40 + 0x3f;
                                  if (-1 < (long)uVar40) {
                                    uVar20 = uVar40;
                                  }
                                  uVar15 = local_168.x * local_b8;
                                  uVar40 = uVar15 + 0x3f;
                                  if (-1 < (long)uVar15) {
                                    uVar40 = uVar15;
                                  }
                                  uVar30 = local_168.y * local_c8;
                                  uVar15 = uVar30 + 0x3f;
                                  if (-1 < (long)uVar30) {
                                    uVar15 = uVar30;
                                  }
                                  FVar13 = FT_DivFix((long)((int)(uVar20 >> 6) + (int)(uVar36 >> 6))
                                                     ,(long)((int)(uVar15 >> 6) +
                                                            (int)(uVar40 >> 6) +
                                                            (int)((ulong)(lVar41 * lVar41) >> 6) +
                                                            (int)((ulong)(lVar14 * lVar14) >> 6)));
                                  uVar38 = uVar38 - (int)FVar13;
                                } while ((uVar38 < 0x10001) &&
                                        (bVar43 = uVar17 < 3, uVar17 = uVar17 + 1, bVar43));
                                iVar6 = (int)local_118 + 1;
                              } while (iVar6 != 5);
                              uVar36 = (ulong)(int)local_110;
                              local_1c0.x = ((long)(int)(lVar37 * uVar36 + 0x8000 +
                                                         ((long)(lVar37 * uVar36) >> 0x3f) >> 0xf) &
                                            0xfffffffffffffffeU) + local_1a0;
                              local_1c0.y = ((long)(int)(lVar19 * uVar36 + 0x8000 +
                                                         ((long)(lVar19 * uVar36) >> 0x3f) >> 0xf) &
                                            0xfffffffffffffffeU) + local_198;
                              lVar37 = local_108 + (long)local_1b0 * -0x400;
                              lVar25 = (long)(int)local_1c0.y * (long)(int)lVar37;
                              lVar19 = (long)(int)local_1c0.x * (long)(int)(local_100 - local_90);
                              bVar43 = (int)((ulong)(lVar19 + 0x8000 + (lVar19 >> 0x3f)) >> 0x10) <=
                                       (int)((ulong)(lVar25 + 0x8000 + (lVar25 >> 0x3f)) >> 0x10);
                              lVar41 = local_100 - local_90;
                              lVar19 = local_168.x;
                              lVar25 = local_168.y;
                              goto joined_r0x0023edc9;
                            }
                            if (SVar2 != SDF_EDGE_LINE) {
                              local_1a8 = (SDF_Contour *)CONCAT44(local_1a8._4_4_,6);
                              puVar11 = local_180;
                              pFVar33 = local_178;
                              goto LAB_0023e03a;
                            }
                            lVar19 = (pSVar26->start_pos).x;
                            lVar25 = (pSVar26->start_pos).y;
                            lVar41 = (pSVar26->end_pos).x - lVar19;
                            lVar37 = (pSVar26->end_pos).y - lVar25;
                            uVar9 = ((long)local_1b0 - lVar19) * lVar41;
                            uVar36 = uVar9 + 0x3f;
                            if (-1 < (long)uVar9) {
                              uVar36 = uVar9;
                            }
                            uVar20 = ((long)local_190 - lVar25) * lVar37;
                            uVar9 = uVar20 + 0x3f;
                            if (-1 < (long)uVar20) {
                              uVar9 = uVar20;
                            }
                            local_168.x = lVar41;
                            local_168.y = lVar37;
                            FVar13 = FT_DivFix((long)((int)(uVar9 >> 6) + (int)(uVar36 >> 6)),
                                               (long)((int)((ulong)(lVar37 * lVar37) >> 6) +
                                                     (int)((ulong)(lVar41 * lVar41) >> 6)));
                            uVar24 = 0x10000;
                            uVar39 = (uint)FVar13;
                            uVar38 = 0x10000;
                            if ((int)uVar39 < 0x10000) {
                              uVar38 = uVar39;
                            }
                            if ((int)uVar38 < 1) {
                              uVar38 = 0;
                            }
                            lVar14 = (long)((int)lVar41 << 10) * (ulong)uVar38;
                            lVar23 = (long)((int)lVar37 << 10) * (ulong)uVar38;
                            local_1c0.x = (lVar19 - (long)local_1b0) * 0x400 +
                                          (lVar14 + 0x8000 + (lVar14 >> 0x3f) >> 0x10);
                            local_1c0.y = (lVar25 - (long)local_190) * 0x400 +
                                          (lVar23 + 0x8000 + (lVar23 >> 0x3f) >> 0x10);
                            lVar19 = (long)(int)lVar37 * (long)(int)local_1c0.x;
                            lVar25 = (long)(int)lVar41 * (long)(int)local_1c0.y;
                            bVar43 = (int)((ulong)(lVar25 + 0x8000 + (lVar25 >> 0x3f)) >> 0x10) <=
                                     (int)((ulong)(lVar19 + 0x8000 + (lVar19 >> 0x3f)) >> 0x10);
                            uVar9 = FT_Vector_Length(&local_1c0);
                            if (0xfffe < uVar39 - 1) {
                              FT_Vector_NormLen(&local_168);
                              FT_Vector_NormLen(&local_1c0);
                              uVar24 = (int)((ulong)((long)(int)local_1c0.y * (long)(int)local_168.x
                                                     + 0x8000 +
                                                    ((long)(int)local_1c0.y * (long)(int)local_168.x
                                                    >> 0x3f)) >> 0x10) -
                                       (int)((ulong)((long)(int)local_1c0.x * (long)(int)local_168.y
                                                     + 0x8000 +
                                                    ((long)(int)local_1c0.x * (long)(int)local_168.y
                                                    >> 0x3f)) >> 0x10);
                            }
                          }
                          local_1a8 = (SDF_Contour *)((ulong)local_1a8._4_4_ << 0x20);
                          bVar44 = -(-bVar43 | 1U);
                          if ((int)local_60 != 1) {
                            bVar44 = -bVar43 | 1U;
                          }
                          iVar6 = (int)uVar9;
                          pSVar26 = local_58;
                          uVar36 = local_e0;
                          lVar37 = local_50;
                          lVar19 = local_d8;
                          lVar25 = local_d0;
                          uVar38 = local_16c;
                          if (iVar6 <= (int)local_16c) {
                            uVar20 = (ulong)(uint)((int)local_68 + (int)local_d0);
                            puVar1 = (ulong *)(local_180 + uVar20 * 3);
                            if ((byte)local_180[uVar20 * 3 + 2] == 0) {
LAB_0023ef0d:
                              *puVar1 = uVar9 & 0xffffffff | (ulong)uVar24 << 0x20;
                              *(byte *)(puVar1 + 1) = bVar44;
                              *(undefined2 *)((long)puVar1 + 9) = 0;
                              *(undefined1 *)((long)puVar1 + 0xb) = 0;
                            }
                            else {
                              uVar31 = (int)*puVar1 - iVar6;
                              uVar39 = -uVar31;
                              if (0 < (int)uVar31) {
                                uVar39 = uVar31;
                              }
                              if (uVar39 < 0x21) {
                                uVar31 = (uint)(*puVar1 >> 0x20);
                                uVar39 = -uVar31;
                                if (0 < (int)uVar31) {
                                  uVar39 = uVar31;
                                }
                                uVar31 = -uVar24;
                                if (0 < (int)uVar24) {
                                  uVar31 = uVar24;
                                }
                                uVar9 = uVar9 & 0xffffffff | (ulong)uVar24 << 0x20;
                                if (uVar31 < uVar39) {
                                  bVar44 = (byte)local_180[uVar20 * 3 + 2];
                                  uVar9 = *puVar1;
                                }
                                *puVar1 = uVar9;
                                *(byte *)(puVar1 + 1) = bVar44;
                              }
                              else if (iVar6 < (int)*puVar1) goto LAB_0023ef0d;
                            }
                          }
                        }
                        lVar25 = lVar25 + 1;
                      } while (lVar25 < lVar19);
                    }
                    lVar37 = lVar37 + 1;
                  } while (lVar37 < local_70);
                }
                uVar9 = local_128;
              }
              pSVar12 = local_78->next;
            } while (pSVar12 != (SDF_Contour_ *)0x0);
          }
          local_190 = (FT_Bitmap *)(ulong)local_184;
          puVar11 = local_180;
          pFVar33 = local_178;
          if (0 < (int)local_184) {
            uVar20 = uVar36 & 0xffffffff;
            pFVar10 = (FT_Bitmap *)0x0;
            local_1a0 = CONCAT44(local_1a0._4_4_,-(uint)(local_a8 == 0)) | 1;
            uVar9 = (ulong)uVar38;
            local_198 = uVar20 * 0xc;
            local_120 = local_120 >> 0x20;
            puVar42 = local_180;
            do {
              local_1b0 = pFVar10;
              if (0 < (int)uVar36) {
                uVar40 = 0;
                puVar11 = puVar42;
                uVar24 = (uint)local_1a0;
                do {
                  uVar39 = uVar38;
                  if ((byte)puVar11[2] != 0) {
                    uVar39 = *puVar11;
                    if ((int)uVar38 <= (int)*puVar11) {
                      uVar39 = uVar38;
                    }
                    uVar24 = (uint)(byte)puVar11[2];
                  }
                  iVar6 = -(int)(char)uVar24;
                  if ((char)local_120 == '\0') {
                    iVar6 = (int)(char)uVar24;
                  }
                  *puVar11 = iVar6 * uVar39;
                  uVar15 = FT_DivFix((long)(int)(iVar6 * uVar39),uVar9);
                  iVar6 = (int)uVar15;
                  uVar30 = (ulong)(uint)-iVar6;
                  if (0 < iVar6) {
                    uVar30 = uVar15 & 0xffffffff;
                  }
                  uVar38 = (uint)(uVar30 >> 9);
                  uVar39 = 0x7f;
                  if ((uint)uVar30 < 0x10000) {
                    uVar39 = uVar38;
                  }
                  if (0 < iVar6) {
                    uVar38 = uVar39;
                  }
                  cVar21 = (char)uVar38;
                  if (0x7f < uVar38) {
                    cVar21 = -0x80;
                  }
                  cVar16 = (char)uVar38;
                  if (iVar6 < 0) {
                    cVar16 = -cVar21;
                  }
                  *(char *)((long)&(local_88->start_pos).x + uVar40) = cVar16 + -0x80;
                  uVar40 = uVar40 + 1;
                  puVar11 = puVar11 + 3;
                  uVar38 = local_16c;
                } while (uVar20 != uVar40);
              }
              pFVar10 = (FT_Bitmap *)((long)&((FT_26D6_Vec *)&local_1b0->rows)->x + 1);
              local_88 = (SDF_Edge *)((long)&(local_88->start_pos).x + uVar20);
              puVar42 = (uint *)((long)puVar42 + local_198);
              puVar11 = local_180;
              pFVar33 = local_178;
            } while (pFVar10 != local_190);
          }
        }
      }
    }
LAB_0023e03a:
    ft_mem_free(pFVar33,puVar11);
    FVar7 = (int)local_1a8;
  }
  return FVar7;
}

Assistant:

static FT_Error
  sdf_generate_subdivision( const SDF_Params  internal_params,
                            SDF_Shape*        shape,
                            FT_UInt           spread,
                            const FT_Bitmap*  bitmap )
  {
    /*
     * Thanks to Alexei for providing the idea of this optimization.
     *
     * We take advantage of two facts.
     *
     * (1) Computing the shortest distance from a point to a line segment is
     *     very fast.
     * (2) We don't have to compute the shortest distance for the entire
     *     two-dimensional grid.
     *
     * Both ideas lead to the following optimization.
     *
     * (1) Split the outlines into a number of line segments.
     *
     * (2) For each line segment, only process its neighborhood.
     *
     * (3) Compute the closest distance to the line only for neighborhood
     *     grid points.
     *
     * This greatly reduces the number of grid points to check.
     */

    FT_Error  error = FT_Err_Ok;


    FT_CALL( split_sdf_shape( shape ) );
    FT_CALL( sdf_generate_bounding_box( internal_params,
                                        shape, spread, bitmap ) );

  Exit:
    return error;
  }